

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# by_all.hpp
# Opt level: O2

tuple<double_&,_double_&>
burst::detail::
by_all_impl<0ul,1ul,burst::front_t,std::tuple<boost::iterator_range<std::_Fwd_list_iterator<double>>&,boost::iterator_range<std::_Fwd_list_iterator<double>>&>>
          (_Tuple_impl<1UL,_double_&> param_1,undefined8 param_2,undefined8 *param_3)

{
  reference pdVar1;
  reference pdVar2;
  _Head_base<0UL,_double_&,_false> extraout_RDX;
  tuple<double_&,_double_&> tVar3;
  
  pdVar1 = boost::iterator_range_detail::
           iterator_range_base<std::_Fwd_list_iterator<double>,_boost::iterators::incrementable_traversal_tag>
           ::front((iterator_range_base<std::_Fwd_list_iterator<double>,_boost::iterators::incrementable_traversal_tag>
                    *)param_3[1]);
  pdVar2 = boost::iterator_range_detail::
           iterator_range_base<std::_Fwd_list_iterator<double>,_boost::iterators::incrementable_traversal_tag>
           ::front((iterator_range_base<std::_Fwd_list_iterator<double>,_boost::iterators::incrementable_traversal_tag>
                    *)*param_3);
  *(reference *)param_1.super__Head_base<1UL,_double_&,_false>._M_head_impl = pdVar2;
  *(reference *)((long)param_1.super__Head_base<1UL,_double_&,_false>._M_head_impl + 8) = pdVar1;
  tVar3.super__Tuple_impl<0UL,_double_&,_double_&>.super__Head_base<0UL,_double_&,_false>.
  _M_head_impl = extraout_RDX._M_head_impl;
  tVar3.super__Tuple_impl<0UL,_double_&,_double_&>.super__Tuple_impl<1UL,_double_&>.
  super__Head_base<1UL,_double_&,_false>._M_head_impl =
       param_1.super__Head_base<1UL,_double_&,_false>._M_head_impl;
  return (tuple<double_&,_double_&>)tVar3.super__Tuple_impl<0UL,_double_&,_double_&>;
}

Assistant:

constexpr decltype(auto)
            by_all_impl (std::index_sequence<Indices...>, UnaryFunction & f, Tuple && t)
        {
            return
                std::tuple
                <
                    invoke_result_t
                    <
                        UnaryFunction &, std::tuple_element_t<Indices, std::decay_t<Tuple>>
                    >...
                >
                (
                    f(std::get<Indices>(std::forward<Tuple>(t)))...
                );
        }